

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void change_extension_to_ply(char *new_filename,char *filename)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  char *filename_ptr;
  long lVar6;
  long lVar7;
  
  uVar3 = 0;
  cVar5 = *filename;
  while (cVar5 != '\0') {
    new_filename[uVar3] = cVar5;
    lVar6 = uVar3 + 1;
    uVar3 = uVar3 + 1;
    cVar5 = filename[lVar6];
  }
  lVar6 = (long)(int)uVar3;
  lVar2 = lVar6 * -0x100000000;
  do {
    lVar7 = lVar2;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) break;
    lVar2 = lVar7 + 0x100000000;
  } while (new_filename[lVar6] != '.');
  if (new_filename[-0x100000000 - lVar7 >> 0x20] == '.') {
    pcVar1 = new_filename + (-lVar7 >> 0x20);
    pcVar4 = pcVar1 + 3;
    pcVar1[0] = 'p';
    pcVar1[1] = 'l';
    pcVar1[2] = 'y';
  }
  else {
    pcVar4 = new_filename + (uVar3 & 0xffffffff) + 4;
    builtin_strncpy(new_filename + (uVar3 & 0xffffffff),".ply",4);
  }
  *pcVar4 = '\0';
  return;
}

Assistant:

static void change_extension_to_ply(char* new_filename, const char* filename)
  {
  const char* filename_ptr = filename;
  int filename_length = 0;
  while (*filename_ptr)
    new_filename[filename_length++] = *filename_ptr++;

  int find_last_dot = filename_length - 1;
  while (find_last_dot)
    {
    if (new_filename[find_last_dot] == '.')
      break;
    --find_last_dot;
    }
  if (new_filename[find_last_dot] == '.')
    {
    new_filename[find_last_dot + 1] = 'p';
    new_filename[find_last_dot + 2] = 'l';
    new_filename[find_last_dot + 3] = 'y';
    new_filename[find_last_dot + 4] = 0;
    }
  else
    {
    new_filename[filename_length + 0] = '.';
    new_filename[filename_length + 1] = 'p';
    new_filename[filename_length + 2] = 'l';
    new_filename[filename_length + 3] = 'y';
    new_filename[filename_length + 4] = 0;
    }
  }